

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_AActor_A_MonsterRail
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *other;
  uint uVar1;
  int iVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  bool local_14b;
  undefined1 local_148 [8];
  FRailParams p;
  undefined1 local_c0 [32];
  double zdiff;
  DVector2 xydiff;
  undefined1 local_88 [16];
  undefined1 local_78 [12];
  TFlags<ActorFlag,_unsigned_int> local_6c;
  undefined1 local_68 [8];
  FTranslatedLineTarget t;
  DAngle saved_pitch;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc34,
                  "int AF_AActor_A_MonsterRail(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar5) {
    other = *(AActor **)&param->field_0;
    local_14b = true;
    if (other != (AActor *)0x0) {
      local_14b = DObject::IsKindOf((DObject *)other,AActor::RegistrationInfo.MyClass);
    }
    if (local_14b != false) {
      pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&other->target);
      if (pAVar3 != (AActor *)0x0) {
        TAngle<double>::TAngle((TAngle<double> *)&t.unlinked,&(other->Angles).Pitch);
        FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)local_68);
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_6c,
                   (int)other +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_6c);
        if (uVar1 != 0) {
          other->visdir = '\x01';
        }
        operator~((int)local_78 + MF_NOSECTOR);
        TFlags<ActorFlag,_unsigned_int>::operator&=(&other->flags,(Self *)(local_78 + 8));
        pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&other->target);
        AActor::AngleTo((AActor *)local_78,other,SUB81(pAVar3,0));
        TAngle<double>::operator=(&(other->Angles).Yaw,(TAngle<double> *)local_78);
        TAngle<double>::TAngle((TAngle<double> *)local_88,&(other->Angles).Yaw);
        TAngle<double>::TAngle((TAngle<double> *)&xydiff.Y,60.0);
        pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&other->target);
        P_AimLineAttack((AActor *)(local_88 + 8),(DAngle *)other,2048.0,
                        (FTranslatedLineTarget *)local_88,(DAngle *)local_68,(int)&xydiff + 8,
                        (AActor *)0x0,pAVar3);
        TAngle<double>::operator=(&(other->Angles).Pitch,(TAngle<double> *)(local_88 + 8));
        if (local_68 == (undefined1  [8])0x0) {
          TObjPtr::operator_cast_to_AActor_((TObjPtr *)&other->target);
          AActor::Vec2To((AActor *)&zdiff,other);
          pAVar3 = TObjPtr<AActor>::operator->(&other->target);
          dVar6 = AActor::Center(pAVar3);
          dVar7 = AActor::Center(other);
          local_c0._24_8_ = (dVar6 - dVar7) - other->Floorclip;
          dVar6 = TVector2<double>::Length((TVector2<double> *)&zdiff);
          VecToAngle(dVar6,(double)local_c0._24_8_);
          TAngle<double>::operator-((TAngle<double> *)(local_c0 + 0x10));
          TAngle<double>::operator=(&(other->Angles).Pitch,(TAngle<double> *)(local_c0 + 0x10));
        }
        pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&other->target);
        pAVar4 = TObjPtr<AActor>::operator->(&other->target);
        dVar6 = (pAVar4->Vel).X;
        pAVar4 = TObjPtr<AActor>::operator->(&other->target);
        AActor::AngleTo((AActor *)local_c0,other,-dVar6 * 3.0,-(pAVar4->Vel).Y * 3.0,SUB81(pAVar3,0)
                       );
        TAngle<double>::operator=(&(other->Angles).Yaw,(TAngle<double> *)local_c0);
        pAVar3 = TObjPtr<AActor>::operator->(&other->target);
        TFlags<ActorFlag,_unsigned_int>::operator&
                  ((TFlags<ActorFlag,_unsigned_int> *)&p.limit,
                   (int)pAVar3 +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&p.limit);
        bVar5 = false;
        if (uVar1 != 0) {
          TFlags<ActorFlag6,_unsigned_int>::operator&
                    ((TFlags<ActorFlag6,_unsigned_int> *)&p.SpiralOffset,
                     (int)other + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
          uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&p.SpiralOffset);
          bVar5 = uVar1 == 0;
        }
        if (bVar5) {
          iVar2 = FRandom::Random2(&pr_railface);
          TAngle<double>::operator+=(&(other->Angles).Yaw,((double)iVar2 * 45.0) / 256.0);
        }
        FRailParams::FRailParams((FRailParams *)local_148);
        local_148 = (undefined1  [8])other;
        p.source._0_4_ = AActor::GetMissileDamage(other,0,1);
        P_RailAttack((FRailParams *)local_148);
        TAngle<double>::operator=(&(other->Angles).Pitch,(TAngle<double> *)&t.unlinked);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xc34,
                  "int AF_AActor_A_MonsterRail(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xc34,
                "int AF_AActor_A_MonsterRail(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MonsterRail)
{
	PARAM_SELF_PROLOGUE(AActor);

	if (!self->target)
		return 0;

	DAngle saved_pitch = self->Angles.Pitch;
	FTranslatedLineTarget t;

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = 1;
	}

	self->flags &= ~MF_AMBUSH;
		
	self->Angles.Yaw = self->AngleTo(self->target);

	self->Angles.Pitch = P_AimLineAttack (self, self->Angles.Yaw, MISSILERANGE, &t, 60., 0, self->target);
	if (t.linetarget == NULL)
	{
		// We probably won't hit the target, but aim at it anyway so we don't look stupid.
		DVector2 xydiff = self->Vec2To(self->target);
		double zdiff = self->target->Center() - self->Center() - self->Floorclip;
		self->Angles.Pitch = -VecToAngle(xydiff.Length(), zdiff);
	}

	// Let the aim trail behind the player
	self->Angles.Yaw = self->AngleTo(self->target, -self->target->Vel.X * 3, -self->target->Vel.Y * 3);

	if (self->target->flags & MF_SHADOW && !(self->flags6 & MF6_SEEINVISIBLE))
	{
		self->Angles.Yaw += pr_railface.Random2() * 45./256;
	}

	FRailParams p;

	p.source = self;
	p.damage = self->GetMissileDamage(0, 1);
	P_RailAttack (&p);
	self->Angles.Pitch = saved_pitch;
	return 0;
}